

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

void __thiscall SAT::clearSeen(SAT *this)

{
  bool *pbVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(this->ivseen_toclear).sz;
  if (uVar3 != 0) {
    pbVar1 = (this->ivseen).data;
    piVar2 = (this->ivseen_toclear).data;
    uVar4 = 0;
    do {
      pbVar1[(uint)piVar2[uVar4]] = false;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if ((this->ivseen_toclear).data != (int *)0x0) {
    (this->ivseen_toclear).sz = 0;
  }
  if ((this->out_learnt).sz != 0) {
    uVar3 = 0;
    do {
      (this->seen).data[(uint)((this->out_learnt).data[uVar3].x >> 1)] = '\0';
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->out_learnt).sz);
  }
  return;
}

Assistant:

void SAT::clearSeen() {
	for (unsigned int i = 0; i < ivseen_toclear.size(); i++) {
		ivseen[ivseen_toclear[i]] = false;
	}
	ivseen_toclear.clear();

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		seen[var(out_learnt[i])] = 0;  // ('seen[]' is now cleared)
	}
}